

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_1aacf::IDLTypeIdentifierVisitor::visit_
          (IDLTypeIdentifierVisitor *this,OpaqueType *type)

{
  UnsupportedType *this_00;
  allocator local_39;
  string local_38;
  
  if (this->m_exporter->m_opaque_as_any == true) {
    std::__cxx11::string::assign((char *)&this->m_namespace);
    std::__cxx11::string::assign((char *)&this->m_front);
    return true;
  }
  this_00 = (UnsupportedType *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string((string *)&local_38,"opaque types are not allowed in IDL",&local_39);
  Typelib::UnsupportedType::UnsupportedType(this_00,(Type *)type,&local_38);
  __cxa_throw(this_00,&Typelib::UnsupportedType::typeinfo,Typelib::UnsupportedType::~UnsupportedType
             );
}

Assistant:

bool IDLTypeIdentifierVisitor::visit_(OpaqueType const& type)
    {
        if (m_exporter.marshalOpaquesAsAny())
        {
            m_namespace = "";
            m_front = "any";
        }
        else
            throw UnsupportedType(type, "opaque types are not allowed in IDL");

        return true;
    }